

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::CornerCoordinates
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,
          TPZFMatrix<double> *coord)

{
  TPZGeoNode *this_00;
  double *pdVar1;
  int j;
  long row;
  int i;
  long col;
  REAL RVar2;
  
  for (col = 0; col != 4; col = col + 1) {
    this_00 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                        (&(((this->super_TPZGeoEl).fMesh)->fNodeVec).
                          super_TPZChunkVector<TPZGeoNode,_10>,
                         (this->fGeo).super_TPZGeoQuad.
                         super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[col]);
    for (row = 0; row != 3; row = row + 1) {
      RVar2 = TPZGeoNode::Coord(this_00,(int)row);
      pdVar1 = TPZFMatrix<double>::operator()(coord,row,col);
      *pdVar1 = RVar2;
    }
  }
  return;
}

Assistant:

inline void TPZGeoElRefLess<TGeo>::CornerCoordinates(TPZFMatrix<REAL> &coord) const
{
    for(int i=0;i<TGeo::NNodes;i++) {
        auto &np = fMesh->NodeVec()[fGeo.fNodeIndexes[i]];
        for(int j=0;j<3;j++) {
            coord(j,i) = np.Coord(j);
        }
    }
}